

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O3

int pcre2_substring_length_byname_16
              (pcre2_match_data_16 *match_data,PCRE2_SPTR16 stringname,size_t *sizeptr)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  PCRE2_SPTR16 last;
  PCRE2_SPTR16 first;
  ushort *local_20;
  ushort *local_18;
  
  uVar4 = 0xffffffd7;
  if (((match_data->matchedby != 1) &&
      (uVar2 = pcre2_substring_nametable_scan_16(match_data->code,stringname,&local_18,&local_20),
      uVar4 = uVar2, -1 < (int)uVar2)) && (uVar4 = 0xffffffca, local_18 <= local_20)) {
    do {
      uVar1 = *local_18;
      if (uVar1 < match_data->oveccount) {
        uVar4 = 0xffffffc9;
        if (match_data->ovector[(ulong)uVar1 * 2] != 0xffffffffffffffff) {
          iVar3 = pcre2_substring_length_bynumber_16(match_data,(uint)uVar1,sizeptr);
          return iVar3;
        }
      }
      local_18 = local_18 + uVar2;
    } while (local_18 <= local_20);
  }
  return uVar4;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_length_byname(pcre2_match_data *match_data,
  PCRE2_SPTR stringname, PCRE2_SIZE *sizeptr)
{
PCRE2_SPTR first, last, entry;
int failrc, entrysize;
if (match_data->matchedby == PCRE2_MATCHEDBY_DFA_INTERPRETER)
  return PCRE2_ERROR_DFA_UFUNC;
entrysize = pcre2_substring_nametable_scan(match_data->code, stringname,
  &first, &last);
if (entrysize < 0) return entrysize;
failrc = PCRE2_ERROR_UNAVAILABLE;
for (entry = first; entry <= last; entry += entrysize)
  {
  uint32_t n = GET2(entry, 0);
  if (n < match_data->oveccount)
    {
    if (match_data->ovector[n*2] != PCRE2_UNSET)
      return pcre2_substring_length_bynumber(match_data, n, sizeptr);
    failrc = PCRE2_ERROR_UNSET;
    }
  }
return failrc;
}